

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O3

DSFrame * __thiscall
DSFrame::Create(DSFrame *__return_storage_ptr__,DSFrame *this,bool copy,bool inplace)

{
  int iVar1;
  DSVideoInfo vi;
  VSFrameRef *pVVar2;
  VSFrameRef *src;
  uchar **ppuVar3;
  uint8_t *puVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  DSFormat *pDVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  VSFrameRef *copy_frames [1];
  int copy_planes [4];
  undefined8 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0 [80];
  VSFrameRef *local_c0;
  undefined1 local_b8 [16];
  int64_t local_a8;
  undefined8 uStack_a0;
  int local_98 [4];
  DSFormat local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  int local_50;
  undefined8 local_4c;
  int64_t local_40;
  undefined8 uStack_38;
  
  bVar9 = 0;
  if (this->_vssrc == (VSFrameRef *)0x0) {
    if ((this->_avssrc).p == (VideoFrame *)0x0) {
      puVar5 = (undefined8 *)
               __cxa_allocate_exception
                         (8,this,CONCAT71(in_register_00000011,copy),
                          CONCAT71(in_register_00000009,inplace));
      *puVar5 = "Unable to create from nothing.";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    iVar1 = (this->_vi).num_frames;
    local_a8 = (this->_vi).num_audio_samples;
    uStack_a0._0_4_ = (this->_vi).nchannels;
    uStack_a0._4_4_ = (this->_vi).image_type;
    uVar7._0_4_ = (this->_vi).fps_numerator;
    uVar7._4_4_ = (this->_vi).fps_denominator;
    local_b8._8_4_ = uVar7._4_4_;
    local_b8._0_8_ = uVar7 & 0xffffffff;
    local_b8._12_4_ = 0;
    DSFormat::DSFormat(&local_88,(this->_vi).pixel_type);
    local_68 = local_b8._0_8_;
    uStack_60 = local_b8._8_8_;
    local_58._0_4_ = (this->_vi).width;
    local_58._4_4_ = (this->_vi).height;
    local_50 = iVar1;
    local_4c._0_4_ = (this->_vi).audio_samples_per_second;
    local_4c._4_4_ = (this->_vi).sample_type;
    local_40 = local_a8;
    uStack_38 = uStack_a0;
    pDVar6 = &local_88;
    puVar5 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar5 = *(undefined8 *)pDVar6;
      pDVar6 = (DSFormat *)((long)pDVar6 + (ulong)bVar9 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    }
    vi.Format.SSW = in_stack_fffffffffffffef0._0_4_;
    vi.Format.SSH = in_stack_fffffffffffffef0._4_4_;
    vi.Format.BitsPerSample = in_stack_fffffffffffffef0._8_4_;
    vi.Format.BytesPerSample = in_stack_fffffffffffffef0._12_4_;
    vi.Format.Planes = in_stack_fffffffffffffef0._16_4_;
    vi._28_4_ = in_stack_fffffffffffffef0._20_4_;
    vi.FPSNum = in_stack_fffffffffffffef0._24_8_;
    vi.FPSDenom = in_stack_fffffffffffffef0._32_8_;
    vi.Width = in_stack_fffffffffffffef0._40_4_;
    vi.Height = in_stack_fffffffffffffef0._44_4_;
    vi.Frames = in_stack_fffffffffffffef0._48_4_;
    vi.Audio_SPS = in_stack_fffffffffffffef0._52_4_;
    vi.Audio_SType = in_stack_fffffffffffffef0._56_4_;
    vi._68_4_ = in_stack_fffffffffffffef0._60_4_;
    vi.Audio_NSamples = in_stack_fffffffffffffef0._64_8_;
    vi.Audio_NChannels = in_stack_fffffffffffffef0._72_4_;
    vi.Field = in_stack_fffffffffffffef0._76_4_;
    vi.Format.IsFamilyYUV = (bool)(char)in_stack_fffffffffffffee8;
    vi.Format.IsFamilyRGB = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 8);
    vi.Format.IsFamilyYCC = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 0x10);
    vi.Format.IsInteger = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 0x18);
    vi.Format.IsFloat = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    vi.Format._5_3_ = (int3)((ulong)in_stack_fffffffffffffee8 >> 0x28);
    Create(__return_storage_ptr__,this,vi);
  }
  else {
    pVVar2 = this->_vssrc;
    if (this->_vsdst != (VSFrameRef *)0x0) {
      pVVar2 = this->_vsdst;
    }
    pVVar2 = (*this->_vsapi->cloneFrameRef)(pVVar2);
    local_98[0] = 0;
    local_98[1] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    local_c0 = pVVar2;
    if (copy) {
      src = (*this->_vsapi->newVideoFrame2)
                      (this->_vsformat,this->FrameWidth,this->FrameHeight,&local_c0,local_98,
                       this->_vssrc,this->_vscore);
      pVVar2 = local_c0;
    }
    else {
      src = (*this->_vsapi->newVideoFrame)
                      (this->_vsformat,this->FrameWidth,this->FrameHeight,this->_vssrc,this->_vscore
                      );
    }
    (*this->_vsapi->freeFrame)(pVVar2);
    DSFrame(__return_storage_ptr__,src,this->_vscore,this->_vsapi);
    __return_storage_ptr__->_vsdst = src;
    iVar1 = (this->Format).Planes;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)iVar1) {
      uVar7 = (long)iVar1 * 8;
    }
    ppuVar3 = (uchar **)operator_new__(uVar7);
    __return_storage_ptr__->DstPointers = ppuVar3;
    if (0 < iVar1) {
      lVar8 = 0;
      do {
        puVar4 = (*this->_vsapi->getWritePtr)(src,(int)lVar8);
        __return_storage_ptr__->DstPointers[lVar8] = puVar4;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->Format).Planes);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DSFrame Create(bool copy, bool inplace)
  {
    if (_vssrc) {
      // Create a new VS frame
      const VSFrameRef* copy_frames[1] {ToVSFrame()};
      int copy_planes[4] = {0};
      auto vsframe = copy ?
        _vsapi->newVideoFrame2(_vsformat, FrameWidth, FrameHeight, copy_frames, copy_planes, _vssrc, const_cast<VSCore*>(_vscore)) :
        _vsapi->newVideoFrame(_vsformat, FrameWidth, FrameHeight, _vssrc, const_cast<VSCore*>(_vscore));
      _vsapi->freeFrame(copy_frames[0]);

      DSFrame new_frame(vsframe, _vscore, _vsapi);
      new_frame._vsdst = vsframe;
      new_frame.DstPointers = new unsigned char*[Format.Planes];
      for (int i = 0; i < Format.Planes; i++)
        new_frame.DstPointers[i] = _vsapi->getWritePtr(vsframe, i);
      return new_frame;
    }
    else if(_avssrc) {
      // Create a new AVS frame
      return Create(_vi);
    }
    throw "Unable to create from nothing.";
  }